

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_bind_text64(sqlite3_stmt *pStmt,int i,char *zData,sqlite3_uint64 nData,
                       _func_void_void_ptr *xDel,uchar enc)

{
  undefined1 local_39;
  uchar enc_local;
  _func_void_void_ptr *xDel_local;
  sqlite3_uint64 nData_local;
  char *zData_local;
  int i_local;
  sqlite3_stmt *pStmt_local;
  
  if (nData < 0x80000000) {
    local_39 = enc;
    if (enc == '\x04') {
      local_39 = '\x02';
    }
    pStmt_local._4_4_ = bindText(pStmt,i,zData,(int)nData,xDel,local_39);
  }
  else {
    pStmt_local._4_4_ = invokeValueDestructor(zData,xDel,(sqlite3_context *)0x0);
  }
  return pStmt_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_bind_text64( 
  sqlite3_stmt *pStmt, 
  int i, 
  const char *zData, 
  sqlite3_uint64 nData, 
  void (*xDel)(void*),
  unsigned char enc
){
  assert( xDel!=SQLITE_DYNAMIC );
  if( nData>0x7fffffff ){
    return invokeValueDestructor(zData, xDel, 0);
  }else{
    if( enc==SQLITE_UTF16 ) enc = SQLITE_UTF16NATIVE;
    return bindText(pStmt, i, zData, (int)nData, xDel, enc);
  }
}